

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void __thiscall QRasterPaintEngineState::QRasterPaintEngineState(QRasterPaintEngineState *this)

{
  QPainterState::QPainterState(&this->super_QPainterState);
  (this->super_QPainterState)._vptr_QPainterState =
       (_func_int **)&PTR__QRasterPaintEngineState_007da220;
  QPen::QPen(&this->lastPen);
  (this->penData).tempImage = (QImage *)0x0;
  (this->penData).solidColor.cspec = Invalid;
  (this->penData).solidColor.ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->penData).solidColor.ct + 2) = 0;
  (this->penData).cachedGradient.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->penData).cachedGradient.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QBrush::QBrush(&this->lastBrush);
  (this->brushData).tempImage = (QImage *)0x0;
  (this->brushData).solidColor.cspec = Invalid;
  (this->brushData).solidColor.ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->brushData).solidColor.ct + 2) = 0;
  this->stroker = (QStrokerOps *)0x0;
  this->strokeFlags = 0;
  (this->brushData).cachedGradient.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->brushData).cachedGradient.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->fillFlags = 0;
  this->pixmapFlags = 0;
  this->intOpacity = 0x100;
  this->txscale = 1.0;
  this->clip = (QClipData *)0x0;
  this->dirty = 0;
  this->field_12 = (anon_union_4_2_742ac80f_for_QRasterPaintEngineState_13)0x1e2;
  return;
}

Assistant:

QRasterPaintEngineState::QRasterPaintEngineState()
{
    stroker = nullptr;

    fillFlags = 0;
    strokeFlags = 0;
    pixmapFlags = 0;

    intOpacity = 256;

    txscale = 1.;

    flag_bits = 0;
    flags.fast_pen = true;
    flags.non_complex_pen = false;
    flags.antialiased = false;
    flags.bilinear = false;
    flags.fast_text = true;
    flags.tx_noshear = true;
    flags.fast_images = true;
    flags.cosmetic_brush = true;

    clip = nullptr;
    flags.has_clip_ownership = false;

    dirty = 0;
}